

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall
GameBoard::checkDirectDropTo(GameBoard *this,int color,int blockType,int x,int y,int o)

{
  int iVar1;
  int iVar2;
  int _y;
  int _x;
  int i;
  int (*def) [8];
  int o_local;
  int y_local;
  int x_local;
  int blockType_local;
  int color_local;
  GameBoard *this_local;
  
  x_local = x;
  do {
    if (0x14 < x_local) {
      return true;
    }
    for (i = 0; i < 4; i = i + 1) {
      iVar1 = blockShape[blockType][o][i << 1] + x_local;
      iVar2 = blockShape[blockType][o][i * 2 + 1] + y;
      if ((iVar1 < 0x15) &&
         ((((iVar1 < 1 || (iVar2 < 1)) || (10 < iVar2)) ||
          (this->gridInfo[color][iVar1][iVar2] != 0)))) {
        return false;
      }
    }
    x_local = x_local + 1;
  } while( true );
}

Assistant:

bool GameBoard::checkDirectDropTo(int color, int blockType, int x, int y, int o)
{
    auto &def = blockShape[blockType][o];
    for (; x <= MAPHEIGHT; x++)
        for (int i = 0; i < 4; i++) {
            int _x = def[i * 2] + x, _y = def[i * 2 + 1] + y;
            if (_x > MAPHEIGHT)
                continue;
            if (_x < 1 || _y < 1 || _y > MAPWIDTH || gridInfo[color][_x][_y])
                return false;
        }
    return true;
}